

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

void __thiscall CInput::UpdateJoystickState(CInput *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ulong uVar4;
  uint uVar5;
  int Axis;
  ulong uVar6;
  float fVar7;
  float fVar8;
  long *plVar3;
  
  iVar1 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[7])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar3 != (long *)0x0) {
    fVar7 = (float)this->m_pConfig->m_JoystickTolerance / 50.0;
    uVar6 = 0;
    while( true ) {
      iVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
      if ((long)iVar1 <= (long)uVar6) break;
      fVar8 = (float)(**(code **)(*plVar3 + 0x30))(plVar3,uVar6 & 0xffffffff);
      this->m_aInputState[uVar6 * 2 + 0x1c2] = fVar8 <= -fVar7;
      this->m_aInputState[uVar6 * 2 + 0x1c3] = fVar7 <= fVar8;
      uVar6 = uVar6 + 1;
    }
    uVar5 = 0x1b0;
    uVar6 = 0;
    while( true ) {
      iVar1 = (**(code **)(*plVar3 + 0x28))(plVar3);
      if ((long)iVar1 <= (long)uVar6) break;
      uVar2 = (**(code **)(*plVar3 + 0x38))(plVar3,uVar6 & 0xffffffff);
      for (uVar4 = (ulong)uVar5; uVar4 + 2 <= (ulong)((int)uVar6 * 8 + 0x1b9); uVar4 = uVar4 + 1) {
        this->m_aInputState[uVar4 + 2] = (ulong)uVar2 - 2 == uVar4;
      }
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 + 8;
    }
  }
  return;
}

Assistant:

void CInput::UpdateJoystickState()
{
	IJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick)
		return;

	const float DeadZone = GetJoystickDeadzone();
	for(int Axis = 0; Axis < pJoystick->GetNumAxes(); Axis++)
	{
		const float Value = pJoystick->GetAxisValue(Axis);
		const int LeftKey = KEY_JOY_AXIS_0_LEFT + 2 * Axis;
		const int RightKey = LeftKey + 1;
		m_aInputState[LeftKey] = Value <= -DeadZone;
		m_aInputState[RightKey] = Value >= DeadZone;
	}

	for(int Hat = 0; Hat < pJoystick->GetNumHats(); Hat++)
	{
		const int HatState = pJoystick->GetHatValue(Hat);
		for(int Key = KEY_JOY_HAT0_LEFTUP + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key <= KEY_JOY_HAT0_RIGHTDOWN + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key++)
			m_aInputState[Key] = Key == HatState;
	}
}